

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O3

void __thiscall KDIS::KDataStream::Read<int>(KDataStream *this,int *T)

{
  ushort uVar1;
  pointer puVar2;
  short sVar3;
  short sVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  NetToDataType<int> OctArray;
  
  OctArray.m_Value = *T;
  puVar2 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = this->m_ui16CurrentWritePos;
  lVar6 = 0;
  do {
    *(uchar *)((long)&OctArray + lVar6) = puVar2[(uint)uVar1 + (int)lVar6 & 0xffff];
    lVar5 = lVar6 + 1;
    this->m_ui16CurrentWritePos = (short)lVar6 + uVar1 + 1;
    lVar6 = lVar5;
  } while (lVar5 != 4);
  if (this->m_MachineEndian != this->m_NetEndian) {
    auVar7 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)OctArray._3_1_
                                                                              << 0x30) >> 0x28),
                                                                      CONCAT14(OctArray._2_1_,
                                                                               OctArray.m_Value)) >>
                                                            0x20),OctArray.m_Value) >> 0x18),
                                       OctArray._1_1_),(ushort)OctArray._0_1_) & 0xffffff00ffffff);
    auVar7 = pshuflw(auVar7,auVar7,0x1b);
    sVar3 = auVar7._0_2_;
    sVar4 = auVar7._2_2_;
    OctArray.field_0.m_Octs[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar7[2] - (0xff < sVar4);
    OctArray.field_0.m_Octs[0] = (0 < sVar3) * (sVar3 < 0x100) * auVar7[0] - (0xff < sVar3);
    sVar3 = auVar7._4_2_;
    OctArray.field_0.m_Octs[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar7[4] - (0xff < sVar3);
    sVar3 = auVar7._6_2_;
    OctArray.field_0.m_Octs[3] = (0 < sVar3) * (sVar3 < 0x100) * auVar7[6] - (0xff < sVar3);
  }
  *T = (int)OctArray;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}